

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O1

void __thiscall
http_response_parsing_smoke01_Test::~http_response_parsing_smoke01_Test
          (http_response_parsing_smoke01_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(http_response_parsing, smoke01)
{
    sub_string str = sub_string::literal(
        "HTTP/1.1 304 Not Modified" "\r\n"
        "Date: Wed, 23 Dec 2015 13:32:04 GMT" "\r\n"
        "Server: Apache/2" "\r\n"
        "ETag: \"277f-3e3073913b100\"" "\r\n"
        "Expires: Wed, 23 Dec 2015 19:32:04 GMT" "\r\n"
        "Cache-Control: max-age=21600" "\r\n"
        "\r\n");
    http_response response = parse_response(str);
    EXPECT_TRUE(str.empty());
}